

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SliceBase.h
# Opt level: O0

uint64_t __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
volatileHash(SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this)

{
  byte bVar1;
  ValueLength VVar2;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *in_RDI;
  uint64_t h;
  size_t size;
  uint64_t *in_stack_00000028;
  uint64_t in_stack_00000030;
  size_t in_stack_00000038;
  void *in_stack_00000040;
  uint64_t local_10;
  
  VVar2 = byteSize(in_RDI);
  if (VVar2 == 1) {
    bVar1 = head((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x11cb89);
    local_10 = SliceStaticData::PrecalculatedHashesForDefaultSeedWYHash[bVar1];
  }
  else {
    start((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x11cbb4);
    local_10 = wyhash(in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028);
  }
  return local_10;
}

Assistant:

inline uint64_t volatileHash() const {
    std::size_t const size = checkOverflow(byteSize());
    if (size == 1) {
      uint64_t h =
          SliceStaticData::PrecalculatedHashesForDefaultSeedWYHash[head()];
      VELOCYPACK_ASSERT(h != 0);
      return h;
    }
    return VELOCYPACK_HASH_WYHASH(start(), size, defaultSeed64);
  }